

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

UINT32 __thiscall VGMPlayer::Render(VGMPlayer *this,UINT32 smplCnt,WAVE_32BS *data)

{
  int iVar1;
  uint uVar2;
  pointer pDVar3;
  pointer pCVar4;
  UINT32 UVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  UVar5 = this->_playSmpl;
  uVar6 = 0;
  while( true ) {
    iVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)UVar5);
    ParseFile(this,iVar1 - this->_playTick);
    iVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_fileTick);
    uVar2 = iVar1 - this->_playSmpl;
    if (((int)uVar2 < 1) ||
       ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar2 = 1;
    }
    UVar5 = smplCnt - (int)uVar6;
    if (uVar2 < UVar5) {
      UVar5 = uVar2;
    }
    pCVar4 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devices).
        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar4) {
      uVar7 = 0;
      do {
        if (pCVar4[uVar7].optID == 0xffffffffffffffff) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)this->_devOpts[pCVar4[uVar7].optID].muteOpts.disable;
        }
        pCVar4 = pCVar4 + uVar7;
        do {
          if (((pCVar4->base).defInf.dataPtr != (DEV_DATA *)0x0) && ((uVar9 & 1) == 0)) {
            Resmpl_Execute(&(pCVar4->base).resmpl,UVar5,data + uVar6);
          }
          pCVar4 = (pointer)(pCVar4->base).linkDev;
          uVar9 = uVar9 >> 1;
        } while (pCVar4 != (pointer)0x0);
        pCVar4 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)(((long)(this->_devices).
                                      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4
                               ) * -0x1111111111111111));
    }
    pDVar3 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish != pDVar3) {
      lVar8 = 0x10;
      uVar7 = 0;
      do {
        (**(code **)(*(long *)((long)&(pDVar3->defInf).dataPtr + lVar8) + 0x30))
                  (*(undefined8 *)((long)pDVar3 + lVar8 + -0x10),UVar5,0);
        uVar7 = uVar7 + 1;
        pDVar3 = (this->_dacStreams).
                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x38;
      } while (uVar7 < (ulong)(((long)(this->_dacStreams).
                                      super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 3
                               ) * 0x6db6db6db6db6db7));
    }
    uVar2 = (int)uVar6 + UVar5;
    uVar6 = (ulong)uVar2;
    UVar5 = UVar5 + this->_playSmpl;
    this->_playSmpl = UVar5;
    if ((this->_psTrigger & 2) != 0) break;
    if (smplCnt <= uVar2) {
      return uVar2;
    }
  }
  this->_psTrigger = this->_psTrigger & 0xfd;
  return uVar2;
}

Assistant:

UINT32 VGMPlayer::Render(UINT32 smplCnt, WAVE_32BS* data)
{
	UINT32 curSmpl;
	UINT32 smplFileTick;
	UINT32 maxSmpl;
	INT32 smplStep;	// might be negative due to rounding errors in Tick2Sample
	size_t curDev;
	
	// Note: use do {} while(), so that "smplCnt == 0" can be used to process until reaching the next sample.
	curSmpl = 0;
	do
	{
		smplFileTick = Sample2Tick(_playSmpl);
		ParseFile(smplFileTick - _playTick);
		
		// render as many samples at once as possible (for better performance)
		maxSmpl = Tick2Sample(_fileTick);
		smplStep = maxSmpl - _playSmpl;
		// When DAC streams are active, limit step size to 1, so that DAC streams and sound chip emulation are in sync.
		if (smplStep < 1 || ! _dacStreams.empty())
			smplStep = 1;	// must render at least 1 sample in order to advance
		if ((UINT32)smplStep > smplCnt - curSmpl)
			smplStep = smplCnt - curSmpl;
		
		for (curDev = 0; curDev < _devices.size(); curDev ++)
		{
			CHIP_DEVICE* cDev = &_devices[curDev];
			UINT8 disable = (cDev->optID != (size_t)-1) ? _devOpts[cDev->optID].muteOpts.disable : 0x00;
			VGM_BASEDEV* clDev;
			
			for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev, disable >>= 1)
			{
				if (clDev->defInf.dataPtr != NULL && ! (disable & 0x01))
					Resmpl_Execute(&clDev->resmpl, smplStep, &data[curSmpl]);
			}
		}
		for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
		{
			DEV_INFO* dacDInf = &_dacStreams[curDev].defInf;
			dacDInf->devDef->Update(dacDInf->dataPtr, smplStep, NULL);
		}
		
		curSmpl += smplStep;
		_playSmpl += smplStep;
		if (_psTrigger & PLAYSTATE_END)
		{
			_psTrigger &= ~PLAYSTATE_END;
			break;
		}
	} while(curSmpl < smplCnt);
	
	return curSmpl;
}